

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<mp::NumericConstant>::Matcher
          (Matcher<mp::NumericConstant> *this,NumericConstant value)

{
  EqMatcher<mp::NumericConstant> this_00;
  ExprBase in_RDI;
  EqMatcher<mp::NumericConstant> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::NumericConstant>::MatcherBase
            ((MatcherBase<mp::NumericConstant> *)0x14bedc);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_0029f1a8;
  this_00 = Eq<mp::NumericConstant>((NumericConstant)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::NumericConstant> *)
            this_00.rhs_.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_,
            (Matcher<mp::NumericConstant> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::NumericConstant> *)0x14bf3a);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }